

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void CTcAbsFixup::fix_abs_fixup(CTcAbsFixup *list_head,ulong final_ofs)

{
  uint32_t tmp;
  CTcAbsFixup *cur;
  undefined4 local_1c;
  
  if (list_head != (CTcAbsFixup *)0x0) {
    do {
      local_1c = (undefined4)final_ofs;
      CTcDataStream::write_at(list_head->ds,list_head->ofs,(char *)&local_1c,4);
      list_head = list_head->nxt;
    } while (list_head != (CTcAbsFixup *)0x0);
  }
  return;
}

Assistant:

void CTcAbsFixup::fix_abs_fixup(CTcAbsFixup *list_head, ulong final_ofs)
{
    CTcAbsFixup *cur;

    /* scan the list and fix up each entry */
    for (cur = list_head ; cur != 0 ; cur = cur->nxt)
    {
        /* 
         *   fix this entry by writing the final offset in UINT4 format to
         *   the target stream at the target offset 
         */
        cur->ds->write4_at(cur->ofs, final_ofs);
    }
}